

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmpolicytctobin.cpp
# Opt level: O0

void fmpolicytctobin::doit(void)

{
  int iVar1;
  char *pcVar2;
  uint local_101c;
  char local_1018 [4];
  int lineno;
  char line [4096];
  fm_policyTC q;
  
  fgets(local_1018,0x1000,_stdin);
  local_101c = 1;
  while( true ) {
    pcVar2 = fgets(local_1018,0x1000,_stdin);
    if (pcVar2 == (char *)0x0) {
      return;
    }
    iVar1 = __isoc99_sscanf(local_1018,"%d,%d,%d,%d",&q,line + 0xff8,line + 0xffc,&q.agg_id);
    if (iVar1 != 4) break;
    fwrite(line + 0xff8,0x10,1,_stdout);
    local_101c = local_101c + 1;
  }
  fprintf(_stderr,"Invalid data in line %d:\n%s",(ulong)local_101c,local_1018);
  return;
}

Assistant:

void doit()
	{

		fm_policyTC q;
		char line[4096];
		int lineno = 0;
		fgets(line, sizeof(line), stdin);
		lineno++;
		while (fgets(line, sizeof(line), stdin) != 0)
		{
			if (sscanf(line, "%d,%d,%d,%d", &q.layer_id, &q.level_id, &q.agg_id, &q.profile_id) != 4) {
				fprintf(stderr, "Invalid data in line %d:\n%s", lineno, line);
				return;
			}
			else
			{
				fwrite(&q, sizeof(q), 1, stdout);
			}
			lineno++;
		}

	}